

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_PrintHexadecimal(FILE *pFile,uint *Sign,int nVars)

{
  uint uVar1;
  int local_28;
  int k;
  int Digit;
  int nDigits;
  int nVars_local;
  uint *Sign_local;
  FILE *pFile_local;
  
  local_28 = (1 << ((byte)nVars & 0x1f)) / 4;
  while (local_28 = local_28 + -1, -1 < local_28) {
    uVar1 = Sign[local_28 / 8] >> ((byte)(local_28 % 8 << 2) & 0x1f) & 0xf;
    if (uVar1 < 10) {
      fprintf((FILE *)pFile,"%d",(ulong)uVar1);
    }
    else {
      fprintf((FILE *)pFile,"%c",(ulong)(uVar1 + 0x57));
    }
  }
  return;
}

Assistant:

void Kit_PrintHexadecimal( FILE * pFile, unsigned Sign[], int nVars )
{
    int nDigits, Digit, k;
    // write the number into the file
    nDigits = (1 << nVars) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((Sign[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'a' + Digit-10 );
    }
//    fprintf( pFile, "\n" );
}